

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLexer.cpp
# Opt level: O0

void __thiscall Jinx::Impl::Lexer::ParseNumber(Lexer *this)

{
  char *__s;
  bool bVar1;
  size_type sVar2;
  Allocator<char> local_89;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> local_88;
  double local_68;
  double number;
  Allocator<char> local_49;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> local_48;
  int64_t local_28;
  int64_t integer;
  char c;
  char *pcStack_18;
  int points;
  char *startNum;
  Lexer *this_local;
  
  pcStack_18 = this->m_current;
  integer._4_4_ = (uint)(*pcStack_18 == '.');
  startNum = (char *)this;
  AdvanceCurrent(this);
  do {
    bVar1 = IsEndOfText(this);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
LAB_0013cc76:
      __s = pcStack_18;
      if ((int)integer._4_4_ < 2) {
        if (integer._4_4_ == 0) {
          local_28 = 0;
          sVar2 = (long)this->m_current - (long)pcStack_18;
          Allocator<char>::Allocator(&local_49);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
          basic_string(&local_48,__s,sVar2,&local_49);
          bVar1 = StringToInteger(&local_48,&local_28);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
          ~basic_string(&local_48);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            CreateSymbol(this,local_28);
          }
          else {
            Error<>(this,"Invalid integer format: unable to convert string to integer");
          }
        }
        else if ((long)this->m_current - (long)pcStack_18 < 2) {
          Error<>(this,"Invalid number format: no digits after decimal place");
        }
        else {
          local_68 = 0.0;
          sVar2 = (long)this->m_current - (long)pcStack_18;
          Allocator<char>::Allocator(&local_89);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
          basic_string(&local_88,__s,sVar2,&local_89);
          bVar1 = StringToNumber(&local_88,&local_68,International);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
          ~basic_string(&local_88);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            CreateSymbol(this,local_68);
          }
          else {
            Error<>(this,"Invalid number format: unable to convert string to double");
          }
        }
      }
      else {
        Error<>(this,"Invalid number format: too many decimal places");
      }
      return;
    }
    integer._3_1_ = *this->m_current;
    bVar1 = IsNumber(this,integer._3_1_);
    if (!bVar1) {
      bVar1 = IsName(this,this->m_current);
      if (bVar1) {
        Error<>(this,"Invalid number format");
      }
      goto LAB_0013cc76;
    }
    if (integer._3_1_ == '.') {
      integer._4_4_ = integer._4_4_ + 1;
    }
    AdvanceCurrent(this);
  } while( true );
}

Assistant:

inline_t void Lexer::ParseNumber()
	{
		const char * startNum = m_current;
		int points = 0;
		if (*startNum == '.')
			points = 1;
		AdvanceCurrent();
		while (!IsEndOfText())
		{
			char c = *m_current;
			if (!IsNumber(c))
			{
				if (IsName(m_current))
				{
					Error("Invalid number format");
					break;
				}
				else
				{
					break;
				}
			}
			if (c == '.')
				++points;
			AdvanceCurrent();
		}
		if (points > 1)
			Error("Invalid number format: too many decimal places");
		else if (points == 0)
		{
			int64_t integer = 0;
			if (!StringToInteger(String(startNum, m_current - startNum), &integer))
			{
				Error("Invalid integer format: unable to convert string to integer");
				return;
			}
			CreateSymbol(integer);
		}
		else
		{
			if (m_current - startNum <= 1)
			{
				Error("Invalid number format: no digits after decimal place");
				return;
			}
			double number = 0.0f;
			if (!StringToNumber(String(startNum, m_current - startNum), &number))
			{
				Error("Invalid number format: unable to convert string to double");
				return;
			}
			CreateSymbol(number);
		}
	}